

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkPartitionNaive(Abc_Ntk_t *pNtk,int nPartSize)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p;
  Vec_Int_t *p_00;
  undefined4 local_30;
  int i;
  int nParts;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vParts;
  int nPartSize_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCoNum(pNtk);
  iVar2 = Abc_NtkCoNum(pNtk);
  p = Vec_VecStart(iVar1 / nPartSize + (uint)(0 < iVar2 % nPartSize));
  for (local_30 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_30 < iVar1; local_30 = local_30 + 1) {
    Abc_NtkCo(pNtk,local_30);
    p_00 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)p,local_30 / nPartSize);
    Vec_IntPush(p_00,local_30);
  }
  return (Vec_Ptr_t *)p;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionNaive( Abc_Ntk_t * pNtk, int nPartSize )
{
    Vec_Ptr_t * vParts;
    Abc_Obj_t * pObj;
    int nParts, i;
    nParts = (Abc_NtkCoNum(pNtk) / nPartSize) + ((Abc_NtkCoNum(pNtk) % nPartSize) > 0);
    vParts = (Vec_Ptr_t *)Vec_VecStart( nParts );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vParts, i / nPartSize), i );
    return vParts;
}